

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-perf-events.h
# Opt level: O2

void __thiscall LinuxEvents<0>::start(LinuxEvents<0> *this)

{
  int iVar1;
  allocator<char> local_29;
  string local_28;
  
  iVar1 = ioctl(this->fd,0x2403,1);
  if (iVar1 == -1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28,"ioctl(PERF_EVENT_IOC_RESET)",&local_29);
    report_error(this,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
  }
  iVar1 = ioctl(this->fd,0x2400,1);
  if (iVar1 == -1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28,"ioctl(PERF_EVENT_IOC_ENABLE)",&local_29);
    report_error(this,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
  }
  return;
}

Assistant:

inline void start() {
    if (ioctl(fd, PERF_EVENT_IOC_RESET, PERF_IOC_FLAG_GROUP) == -1) {
      report_error("ioctl(PERF_EVENT_IOC_RESET)");
    }

    if (ioctl(fd, PERF_EVENT_IOC_ENABLE, PERF_IOC_FLAG_GROUP) == -1) {
      report_error("ioctl(PERF_EVENT_IOC_ENABLE)");
    }
  }